

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::apply
          (QControlledGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  _ComplexT_conflict _Var1;
  complex<float> cVar2;
  _ComplexT_conflict _Var3;
  ulong uVar4;
  complex<float> *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  QControlledGate2<std::complex<float>_> *pQVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  char *__assertion;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar23;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Db;
  undefined8 uVar24;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined8 uVar25;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<std::complex<float>_> local_e0;
  QControlledGate2<std::complex<float>_> *local_d0;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  long local_b8;
  long local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int *local_60 [2];
  long local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_d0 = this;
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (local_60);
  iVar6 = *local_60[0];
  *local_60[0] = iVar6 + offset;
  iVar7 = local_60[0][1];
  local_60[0][1] = offset + iVar7;
  if (iVar6 + offset < nbQubits) {
    if (offset + iVar7 < nbQubits) {
      iVar6 = (*(local_d0->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                _vptr_QObject[0x10])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))
                (&local_e0,(long *)CONCAT44(extraout_var,iVar6));
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_e0);
      iVar6 = local_d0->control_;
      iVar7 = (*(local_d0->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                _vptr_QObject[0xf])();
      pQVar12 = local_d0;
      if (iVar6 < iVar7) {
        iVar6 = (*(local_d0->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                  ._vptr_QObject[0xf])(local_d0);
        iVar7 = 1 << ((char)iVar6 - (char)pQVar12->control_ & 0x1fU);
        iVar6 = (*(pQVar12->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar12);
        uVar8 = (*(pQVar12->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar12);
        lVar16 = (long)iVar7;
        iVar15 = ~uVar8 + nbQubits;
        lVar10 = (long)(1 << ((byte)iVar6 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar15 & 0x1f));
        lVar11 = matrix->size_;
        if (side == Left) {
          if (0 < lVar11) {
            lVar14 = 1;
            if (1 < lVar17) {
              lVar14 = lVar17;
            }
            lVar19 = 1;
            if (1 < lVar10) {
              lVar19 = lVar10;
            }
            lVar10 = 0;
            do {
              if (iVar6 != 0x1f) {
                local_b8 = 0;
                lVar11 = 0;
                do {
                  local_b0 = lVar11;
                  if (local_d0->controlState_ == 1) {
                    if ((long)(iVar7 / 2) <= lVar11 % lVar16) goto LAB_0011abe2;
                  }
                  else if ((local_d0->controlState_ != 0) || (lVar11 % lVar16 < (long)(iVar7 / 2)))
                  {
LAB_0011abe2:
                    lVar11 = local_b8;
                    lVar18 = lVar14;
                    if (iVar15 != 0x1f) {
                      do {
                        pcVar5 = (matrix->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        lVar13 = matrix->size_ * lVar11;
                        fVar22 = *(float *)&pcVar5[lVar13 + lVar10]._M_value;
                        fVar28 = *(float *)((long)&pcVar5[lVar13 + lVar10]._M_value + 4);
                        _Var1 = pcVar5[matrix->size_ * (lVar17 + lVar11) + lVar10]._M_value;
                        fVar31 = (float)_Var1;
                        fVar23 = (float)(_Var1 >> 0x20);
                        cVar2._M_value =
                             *(_ComplexT_conflict *)
                              local_e0.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        fVar21 = (float)(cVar2._M_value >> 0x20);
                        fVar36 = fVar22 * (float)cVar2._M_value - fVar28 * fVar21;
                        fVar37 = fVar22 * 0.0 - fVar28 * 0.0;
                        fVar38 = fVar22 * 0.0 - fVar28 * 0.0;
                        fVar30 = fVar22 * fVar21 + fVar28 * (float)cVar2._M_value;
                        uVar39 = 0;
                        uVar40 = 0;
                        uVar41 = 0;
                        uVar42 = 0;
                        uVar43 = 0;
                        uVar44 = 0;
                        fVar27 = fVar22;
                        fVar45 = fVar22;
                        fVar34 = fVar22;
                        fVar32 = fVar22;
                        fVar47 = fVar28;
                        fVar46 = fVar28;
                        fVar48 = fVar28;
                        fVar49 = fVar28;
                        if ((NAN(fVar36)) && (NAN(fVar30))) {
                          _local_c8 = ZEXT416((uint)fVar22);
                          local_88 = ZEXT416((uint)fVar28);
                          local_98._4_4_ = fVar22;
                          local_98._0_4_ = fVar22;
                          fStack_90 = fVar22;
                          fStack_8c = fVar22;
                          local_a8 = fVar28;
                          fStack_a4 = fVar28;
                          fStack_a0 = fVar28;
                          fStack_9c = fVar28;
                          uVar24 = __mulsc3(cVar2._M_value,fVar21,fVar22,fVar28);
                          fVar36 = (float)uVar24;
                          fVar30 = (float)((ulong)uVar24 >> 0x20);
                          fVar37 = (float)extraout_XMM0_Qb;
                          fVar38 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
                          fVar22 = (float)local_c8._0_4_;
                          uVar39 = local_c8._4_4_;
                          uVar40 = uStack_c0;
                          uVar41 = uStack_bc;
                          fVar28 = (float)local_88._0_4_;
                          uVar42 = local_88._4_4_;
                          uVar43 = local_88._8_4_;
                          uVar44 = local_88._12_4_;
                          fVar27 = (float)local_98._0_4_;
                          fVar45 = (float)local_98._4_4_;
                          fVar34 = fStack_90;
                          fVar32 = fStack_8c;
                          fVar47 = local_a8;
                          fVar46 = fStack_a4;
                          fVar48 = fStack_a0;
                          fVar49 = fStack_9c;
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))->_M_value;
                        fVar33 = (float)(_Var3 >> 0x20);
                        fVar21 = fVar31 * (float)_Var3 - fVar23 * fVar33;
                        fVar26 = (float)_Var3 * fVar23 + fVar33 * fVar31;
                        if ((NAN(fVar21)) && (NAN(fVar26))) {
                          local_c8._4_4_ = uVar39;
                          local_c8._0_4_ = fVar22;
                          uStack_c0 = uVar40;
                          uStack_bc = uVar41;
                          local_88._4_4_ = uVar42;
                          local_88._0_4_ = fVar28;
                          local_88._8_4_ = uVar43;
                          local_88._12_4_ = uVar44;
                          local_98._4_4_ = fVar45;
                          local_98._0_4_ = fVar27;
                          fStack_90 = fVar34;
                          fStack_8c = fVar32;
                          local_a8 = fVar47;
                          fStack_a4 = fVar46;
                          fStack_a0 = fVar48;
                          fStack_9c = fVar49;
                          local_78 = fVar36;
                          fStack_74 = fVar30;
                          fStack_70 = fVar37;
                          fStack_6c = fVar38;
                          __mulsc3(_Var3,fVar33,_Var1,fVar23);
                          fVar22 = (float)local_c8._0_4_;
                          uVar39 = local_c8._4_4_;
                          fVar28 = (float)local_88._0_4_;
                          fVar27 = (float)local_98._0_4_;
                          fVar45 = (float)local_98._4_4_;
                          fVar47 = local_a8;
                          fVar46 = fStack_a4;
                          fVar36 = local_78;
                          fVar30 = fStack_74;
                          fVar21 = extraout_XMM0_Da;
                          fVar26 = extraout_XMM0_Db;
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [matrix->size_ * lVar11 + lVar10]._M_value =
                             CONCAT44(fVar30 + fVar26,fVar36 + fVar21);
                        _Var3 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + local_e0.size_ * 8))->_M_value;
                        fVar34 = (float)(_Var3 >> 0x20);
                        fVar27 = fVar27 * (float)_Var3 - fVar46 * fVar34;
                        fVar45 = fVar45 * fVar34 + fVar47 * (float)_Var3;
                        if ((NAN(fVar27)) && (NAN(fVar45))) {
                          uVar24 = __mulsc3(_Var3,fVar34,CONCAT44(uVar39,fVar22),fVar28);
                          fVar27 = (float)uVar24;
                          fVar45 = (float)((ulong)uVar24 >> 0x20);
                        }
                        _Var3 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))[local_e0.size_]._M_value;
                        fVar34 = (float)(_Var3 >> 0x20);
                        fVar22 = fVar31 * (float)_Var3 - fVar23 * fVar34;
                        fVar28 = (float)_Var3 * fVar23 + fVar34 * fVar31;
                        if ((NAN(fVar22)) && (NAN(fVar28))) {
                          __mulsc3(_Var3,fVar34,_Var1,fVar23);
                          fVar22 = extraout_XMM0_Da_00;
                          fVar28 = extraout_XMM0_Db_00;
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [(lVar17 + lVar11) * matrix->size_ + lVar10]._M_value =
                             CONCAT44(fVar45 + fVar28,fVar27 + fVar22);
                        lVar18 = lVar18 + -1;
                        lVar11 = lVar11 + 1;
                      } while (lVar18 != 0);
                    }
                  }
                  lVar11 = local_b0 + 1;
                  local_b8 = local_b8 + lVar17 * 2;
                } while (lVar11 != lVar19);
                lVar11 = matrix->size_;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < lVar11);
          }
        }
        else if (0 < lVar11) {
          lVar14 = 1;
          if (1 < lVar17) {
            lVar14 = lVar17;
          }
          lVar19 = 1;
          if (1 < lVar10) {
            lVar19 = lVar10;
          }
          local_b0 = lVar17 << 4;
          lVar18 = 0;
          lVar10 = 0;
          do {
            if (iVar6 != 0x1f) {
              lVar11 = 0;
              lVar13 = 0;
              local_b8 = lVar10;
              do {
                if (local_d0->controlState_ == 1) {
                  if ((long)(iVar7 / 2) <= lVar13 % lVar16) goto LAB_0011b98f;
                }
                else if ((local_d0->controlState_ != 0) || (lVar13 % lVar16 < (long)(iVar7 / 2))) {
LAB_0011b98f:
                  lVar10 = lVar11;
                  lVar20 = lVar14;
                  if (iVar15 != 0x1f) {
                    do {
                      lVar9 = matrix->size_ * lVar18;
                      pcVar5 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar22 = *(float *)((long)&pcVar5->_M_value + lVar10 + lVar9);
                      fVar28 = *(float *)((long)&pcVar5->_M_value + lVar10 + 4 + lVar9);
                      uVar24 = *(undefined8 *)((long)&pcVar5[lVar17]._M_value + lVar10 + lVar9);
                      fVar31 = (float)uVar24;
                      fVar23 = (float)((ulong)uVar24 >> 0x20);
                      cVar2._M_value =
                           *(_ComplexT_conflict *)
                            local_e0.data_._M_t.
                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar21 = (float)(cVar2._M_value >> 0x20);
                      fVar36 = fVar22 * (float)cVar2._M_value - fVar28 * fVar21;
                      fVar37 = fVar22 * 0.0 - fVar28 * 0.0;
                      fVar38 = fVar22 * 0.0 - fVar28 * 0.0;
                      fVar30 = fVar22 * fVar21 + fVar28 * (float)cVar2._M_value;
                      uVar39 = 0;
                      uVar40 = 0;
                      uVar41 = 0;
                      uVar42 = 0;
                      uVar43 = 0;
                      uVar44 = 0;
                      fVar27 = fVar22;
                      fVar45 = fVar22;
                      fVar34 = fVar22;
                      fVar32 = fVar22;
                      fVar47 = fVar28;
                      fVar46 = fVar28;
                      fVar48 = fVar28;
                      fVar49 = fVar28;
                      if ((NAN(fVar36)) && (NAN(fVar30))) {
                        _local_c8 = ZEXT416((uint)fVar22);
                        local_88 = ZEXT416((uint)fVar28);
                        local_98._4_4_ = fVar22;
                        local_98._0_4_ = fVar22;
                        fStack_90 = fVar22;
                        fStack_8c = fVar22;
                        local_a8 = fVar28;
                        fStack_a4 = fVar28;
                        fStack_a0 = fVar28;
                        fStack_9c = fVar28;
                        uVar25 = __mulsc3(cVar2._M_value,fVar21,fVar22,fVar28);
                        fVar36 = (float)uVar25;
                        fVar30 = (float)((ulong)uVar25 >> 0x20);
                        fVar37 = (float)extraout_XMM0_Qb_02;
                        fVar38 = (float)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                        fVar22 = (float)local_c8._0_4_;
                        uVar39 = local_c8._4_4_;
                        uVar40 = uStack_c0;
                        uVar41 = uStack_bc;
                        fVar28 = (float)local_88._0_4_;
                        uVar42 = local_88._4_4_;
                        uVar43 = local_88._8_4_;
                        uVar44 = local_88._12_4_;
                        fVar27 = (float)local_98._0_4_;
                        fVar45 = (float)local_98._4_4_;
                        fVar34 = fStack_90;
                        fVar32 = fStack_8c;
                        fVar47 = local_a8;
                        fVar46 = fStack_a4;
                        fVar48 = fStack_a0;
                        fVar49 = fStack_9c;
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + local_e0.size_ * 8))->_M_value;
                      fVar26 = (float)(_Var1 >> 0x20);
                      fVar21 = fVar31 * (float)_Var1 - fVar23 * fVar26;
                      fVar33 = (float)_Var1 * fVar23 + fVar26 * fVar31;
                      if ((NAN(fVar21)) && (NAN(fVar33))) {
                        local_c8._4_4_ = uVar39;
                        local_c8._0_4_ = fVar22;
                        uStack_c0 = uVar40;
                        uStack_bc = uVar41;
                        local_88._4_4_ = uVar42;
                        local_88._0_4_ = fVar28;
                        local_88._8_4_ = uVar43;
                        local_88._12_4_ = uVar44;
                        local_98._4_4_ = fVar45;
                        local_98._0_4_ = fVar27;
                        fStack_90 = fVar34;
                        fStack_8c = fVar32;
                        local_a8 = fVar47;
                        fStack_a4 = fVar46;
                        fStack_a0 = fVar48;
                        fStack_9c = fVar49;
                        local_78 = fVar36;
                        fStack_74 = fVar30;
                        fStack_70 = fVar37;
                        fStack_6c = fVar38;
                        uVar25 = __mulsc3(_Var1,fVar26,uVar24,fVar23);
                        fVar21 = (float)uVar25;
                        fVar33 = (float)((ulong)uVar25 >> 0x20);
                        fVar22 = (float)local_c8._0_4_;
                        uVar39 = local_c8._4_4_;
                        fVar28 = (float)local_88._0_4_;
                        fVar27 = (float)local_98._0_4_;
                        fVar45 = (float)local_98._4_4_;
                        fVar47 = local_a8;
                        fVar46 = fStack_a4;
                        fVar36 = local_78;
                        fVar30 = fStack_74;
                      }
                      *(ulong *)((long)&((matrix->data_)._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl)->_M_value + lVar10 + matrix->size_ * lVar18) =
                           CONCAT44(fVar30 + fVar33,fVar36 + fVar21);
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))->_M_value;
                      fVar34 = (float)(_Var1 >> 0x20);
                      fVar27 = fVar27 * (float)_Var1 - fVar46 * fVar34;
                      fVar45 = fVar45 * fVar34 + fVar47 * (float)_Var1;
                      if ((NAN(fVar27)) && (NAN(fVar45))) {
                        uVar25 = __mulsc3(_Var1,fVar34,CONCAT44(uVar39,fVar22),fVar28);
                        fVar27 = (float)uVar25;
                        fVar45 = (float)((ulong)uVar25 >> 0x20);
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))[local_e0.size_]._M_value;
                      fVar28 = (float)(_Var1 >> 0x20);
                      fVar22 = fVar31 * (float)_Var1 - fVar23 * fVar28;
                      fVar34 = (float)_Var1 * fVar23 + fVar28 * fVar31;
                      if ((NAN(fVar22)) && (NAN(fVar34))) {
                        uVar24 = __mulsc3(_Var1,fVar28,uVar24,fVar23);
                        fVar22 = (float)uVar24;
                        fVar34 = (float)((ulong)uVar24 >> 0x20);
                      }
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar17]._M_value +
                                lVar10 + matrix->size_ * lVar18) =
                           CONCAT44(fVar45 + fVar34,fVar27 + fVar22);
                      lVar20 = lVar20 + -1;
                      lVar10 = lVar10 + 8;
                    } while (lVar20 != 0);
                  }
                }
                lVar13 = lVar13 + 1;
                lVar11 = lVar11 + local_b0;
              } while (lVar13 != lVar19);
              lVar11 = matrix->size_;
              lVar10 = local_b8;
            }
            lVar10 = lVar10 + 1;
            lVar18 = lVar18 + 8;
          } while (lVar10 < lVar11);
        }
      }
      else {
        iVar7 = 1 << ((byte)nbQubits - (char)local_d0->control_ & 0x1f);
        iVar6 = (*(local_d0->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                  ._vptr_QObject[0xf])(local_d0);
        uVar8 = (*(pQVar12->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                  _vptr_QObject[0xf])(pQVar12);
        pQVar12 = local_d0;
        lVar16 = (long)iVar7;
        iVar15 = ~uVar8 + nbQubits;
        lVar10 = (long)(1 << ((byte)iVar6 & 0x1f));
        lVar17 = (long)(1 << ((byte)iVar15 & 0x1f));
        lVar11 = matrix->size_;
        if (side == Left) {
          if (0 < lVar11) {
            local_b0 = 1;
            if (1 < lVar17) {
              local_b0 = lVar17;
            }
            lVar14 = 1;
            if (1 < lVar10) {
              lVar14 = lVar10;
            }
            lVar10 = 0;
            do {
              if (iVar6 != 0x1f) {
                lVar19 = 0;
                lVar11 = 0;
                pQVar12 = local_d0;
                do {
                  if (iVar15 != 0x1f) {
                    local_b8 = lVar17 + lVar19;
                    lVar18 = 0;
                    do {
                      if (pQVar12->controlState_ == 1) {
                        if ((long)(iVar7 / 2) <= lVar18 % lVar16) goto LAB_0011b0cc;
                      }
                      else if ((pQVar12->controlState_ != 0) ||
                              (lVar18 % lVar16 < (long)(iVar7 / 2))) {
LAB_0011b0cc:
                        lVar13 = local_b8 + lVar18;
                        pcVar5 = (matrix->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        lVar20 = matrix->size_ * (lVar19 + lVar18);
                        fVar22 = *(float *)&pcVar5[lVar20 + lVar10]._M_value;
                        fVar28 = *(float *)((long)&pcVar5[lVar20 + lVar10]._M_value + 4);
                        uVar4 = pcVar5[matrix->size_ * lVar13 + lVar10]._M_value;
                        fVar45 = (float)(uVar4 >> 0x20);
                        cVar2._M_value =
                             *(_ComplexT_conflict *)
                              local_e0.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                        fVar23 = (float)(cVar2._M_value >> 0x20);
                        fVar38 = fVar22 * (float)cVar2._M_value - fVar28 * fVar23;
                        fVar26 = fVar22 * 0.0 - fVar28 * 0.0;
                        fVar33 = fVar22 * 0.0 - fVar28 * 0.0;
                        fVar31 = fVar22 * fVar23 + fVar28 * (float)cVar2._M_value;
                        fVar27 = (float)uVar4;
                        uVar39 = 0;
                        uVar40 = 0;
                        uVar41 = 0;
                        uVar42 = 0;
                        uVar43 = 0;
                        uVar44 = 0;
                        fVar34 = (float)0;
                        fVar32 = (float)0;
                        fVar47 = fVar22;
                        fVar46 = fVar22;
                        fVar48 = fVar22;
                        fVar49 = fVar22;
                        fVar36 = fVar28;
                        fVar30 = fVar28;
                        fVar21 = fVar28;
                        fVar37 = fVar28;
                        if ((NAN(fVar38)) && (NAN(fVar31))) {
                          _uStack_c0 = 0;
                          local_c8 = (undefined1  [8])uVar4;
                          local_88 = ZEXT416((uint)fVar22);
                          _local_98 = ZEXT416((uint)fVar28);
                          local_a8 = fVar22;
                          fStack_a4 = fVar22;
                          fStack_a0 = fVar22;
                          fStack_9c = fVar22;
                          local_78 = fVar28;
                          fStack_74 = fVar28;
                          fStack_70 = fVar28;
                          fStack_6c = fVar28;
                          uVar24 = __mulsc3(cVar2._M_value,fVar23,fVar22,fVar28);
                          fVar38 = (float)uVar24;
                          fVar31 = (float)((ulong)uVar24 >> 0x20);
                          fVar26 = (float)extraout_XMM0_Qb_00;
                          fVar33 = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                          fVar27 = (float)local_c8._0_4_;
                          fVar45 = (float)local_c8._4_4_;
                          uVar39 = uStack_c0;
                          uVar40 = uStack_bc;
                          fVar22 = (float)local_88._0_4_;
                          uVar41 = local_88._4_4_;
                          uVar42 = local_88._8_4_;
                          uVar43 = local_88._12_4_;
                          fVar28 = (float)local_98._0_4_;
                          uVar44 = local_98._4_4_;
                          fVar34 = fStack_90;
                          fVar32 = fStack_8c;
                          fVar47 = local_a8;
                          fVar46 = fStack_a4;
                          fVar48 = fStack_a0;
                          fVar49 = fStack_9c;
                          fVar36 = local_78;
                          fVar30 = fStack_74;
                          fVar21 = fStack_70;
                          fVar37 = fStack_6c;
                        }
                        _Var1 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + 8))->_M_value;
                        fVar35 = (float)(_Var1 >> 0x20);
                        fVar23 = fVar27 * (float)_Var1 - fVar45 * fVar35;
                        fVar29 = (float)_Var1 * fVar45 + fVar35 * fVar27;
                        if ((NAN(fVar23)) && (NAN(fVar29))) {
                          local_c8._4_4_ = fVar45;
                          local_c8._0_4_ = fVar27;
                          uStack_c0 = uVar39;
                          uStack_bc = uVar40;
                          local_88._4_4_ = uVar41;
                          local_88._0_4_ = fVar22;
                          local_88._8_4_ = uVar42;
                          local_88._12_4_ = uVar43;
                          local_98._4_4_ = uVar44;
                          local_98._0_4_ = fVar28;
                          fStack_90 = fVar34;
                          fStack_8c = fVar32;
                          local_a8 = fVar47;
                          fStack_a4 = fVar46;
                          fStack_a0 = fVar48;
                          fStack_9c = fVar49;
                          local_78 = fVar36;
                          fStack_74 = fVar30;
                          fStack_70 = fVar21;
                          fStack_6c = fVar37;
                          local_48 = fVar38;
                          fStack_44 = fVar31;
                          fStack_40 = fVar26;
                          fStack_3c = fVar33;
                          __mulsc3(_Var1,fVar35,CONCAT44(fVar45,fVar27),fVar45);
                          fVar27 = (float)local_c8._0_4_;
                          fVar45 = (float)local_c8._4_4_;
                          uVar39 = uStack_c0;
                          uVar40 = uStack_bc;
                          fVar22 = (float)local_88._0_4_;
                          uVar41 = local_88._4_4_;
                          fVar28 = (float)local_98._0_4_;
                          fVar47 = local_a8;
                          fVar46 = fStack_a4;
                          fVar36 = local_78;
                          fVar30 = fStack_74;
                          fVar38 = local_48;
                          fVar31 = fStack_44;
                          fVar23 = extraout_XMM0_Da_01;
                          fVar29 = extraout_XMM0_Db_01;
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [(lVar19 + lVar18) * matrix->size_ + lVar10]._M_value =
                             CONCAT44(fVar31 + fVar29,fVar38 + fVar23);
                        _Var1 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + local_e0.size_ * 8))->_M_value;
                        fVar32 = (float)(_Var1 >> 0x20);
                        fVar34 = fVar47 * (float)_Var1 - fVar30 * fVar32;
                        fVar47 = fVar46 * fVar32 + fVar36 * (float)_Var1;
                        if ((NAN(fVar34)) && (NAN(fVar47))) {
                          local_c8._4_4_ = fVar45;
                          local_c8._0_4_ = fVar27;
                          uStack_c0 = uVar39;
                          uStack_bc = uVar40;
                          uVar24 = __mulsc3(_Var1,fVar32,CONCAT44(uVar41,fVar22),fVar28);
                          fVar34 = (float)uVar24;
                          fVar47 = (float)((ulong)uVar24 >> 0x20);
                          fVar27 = (float)local_c8._0_4_;
                          fVar45 = (float)local_c8._4_4_;
                        }
                        _Var1 = ((complex<float> *)
                                ((long)local_e0.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl + (local_e0.size_ + 1) * 8))->_M_value;
                        fVar28 = (float)(_Var1 >> 0x20);
                        fVar22 = fVar27 * (float)_Var1 - fVar45 * fVar28;
                        fVar32 = (float)_Var1 * fVar45 + fVar28 * fVar27;
                        if ((NAN(fVar22)) && (NAN(fVar32))) {
                          uVar24 = __mulsc3(_Var1,fVar28,CONCAT44(fVar45,fVar27),fVar45);
                          fVar22 = (float)uVar24;
                          fVar32 = (float)((ulong)uVar24 >> 0x20);
                        }
                        (matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                        [lVar13 * matrix->size_ + lVar10]._M_value =
                             CONCAT44(fVar47 + fVar32,fVar34 + fVar22);
                        pQVar12 = local_d0;
                      }
                      lVar18 = lVar18 + 1;
                    } while (local_b0 != lVar18);
                  }
                  lVar11 = lVar11 + 1;
                  lVar19 = lVar19 + lVar17 * 2;
                } while (lVar11 != lVar14);
                lVar11 = matrix->size_;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < lVar11);
          }
        }
        else if (0 < lVar11) {
          lVar14 = 1;
          if (1 < lVar17) {
            lVar14 = lVar17;
          }
          lVar19 = 1;
          if (1 < lVar10) {
            lVar19 = lVar10;
          }
          local_b8 = lVar17 << 4;
          lVar18 = 0;
          lVar10 = 0;
          do {
            if (iVar6 != 0x1f) {
              lVar13 = 0;
              lVar11 = 0;
              do {
                local_b0 = lVar11;
                if (iVar15 != 0x1f) {
                  lVar11 = 0;
                  do {
                    if (pQVar12->controlState_ == 1) {
                      if ((long)(iVar7 / 2) <= lVar11 % lVar16) goto LAB_0011b54c;
                    }
                    else if ((pQVar12->controlState_ != 0) || (lVar11 % lVar16 < (long)(iVar7 / 2)))
                    {
LAB_0011b54c:
                      pcVar5 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      lVar20 = lVar13 + matrix->size_ * lVar18;
                      fVar22 = *(float *)((long)&pcVar5[lVar11]._M_value + lVar20);
                      fVar28 = *(float *)((long)&pcVar5[lVar11]._M_value + lVar20 + 4);
                      uVar24 = *(undefined8 *)((long)&pcVar5[lVar11 + lVar17]._M_value + lVar20);
                      fVar31 = (float)uVar24;
                      fVar23 = (float)((ulong)uVar24 >> 0x20);
                      _Var1 = *(_ComplexT_conflict *)
                               local_e0.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar21 = (float)(_Var1 >> 0x20);
                      fVar36 = fVar22 * (float)_Var1 - fVar28 * fVar21;
                      fVar37 = fVar22 * 0.0 - fVar28 * 0.0;
                      fVar38 = fVar22 * 0.0 - fVar28 * 0.0;
                      fVar30 = fVar22 * fVar21 + fVar28 * (float)_Var1;
                      uVar39 = 0;
                      uVar40 = 0;
                      uVar41 = 0;
                      uVar42 = 0;
                      uVar43 = 0;
                      uVar44 = 0;
                      fVar27 = fVar22;
                      fVar45 = fVar22;
                      fVar34 = fVar22;
                      fVar32 = fVar22;
                      fVar47 = fVar28;
                      fVar46 = fVar28;
                      fVar48 = fVar28;
                      fVar49 = fVar28;
                      if ((NAN(fVar36)) && (NAN(fVar30))) {
                        _local_c8 = ZEXT416((uint)fVar22);
                        local_88 = ZEXT416((uint)fVar28);
                        local_98._4_4_ = fVar22;
                        local_98._0_4_ = fVar22;
                        fStack_90 = fVar22;
                        fStack_8c = fVar22;
                        local_a8 = fVar28;
                        fStack_a4 = fVar28;
                        fStack_a0 = fVar28;
                        fStack_9c = fVar28;
                        uVar25 = __mulsc3(_Var1,fVar21,fVar22,fVar28);
                        fVar36 = (float)uVar25;
                        fVar30 = (float)((ulong)uVar25 >> 0x20);
                        fVar37 = (float)extraout_XMM0_Qb_01;
                        fVar38 = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                        fVar22 = (float)local_c8._0_4_;
                        uVar39 = local_c8._4_4_;
                        uVar40 = uStack_c0;
                        uVar41 = uStack_bc;
                        fVar28 = (float)local_88._0_4_;
                        uVar42 = local_88._4_4_;
                        uVar43 = local_88._8_4_;
                        uVar44 = local_88._12_4_;
                        fVar27 = (float)local_98._0_4_;
                        fVar45 = (float)local_98._4_4_;
                        fVar34 = fStack_90;
                        fVar32 = fStack_8c;
                        fVar47 = local_a8;
                        fVar46 = fStack_a4;
                        fVar48 = fStack_a0;
                        fVar49 = fStack_9c;
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + local_e0.size_ * 8))->_M_value;
                      fVar33 = (float)(_Var1 >> 0x20);
                      fVar21 = fVar31 * (float)_Var1 - fVar23 * fVar33;
                      fVar26 = (float)_Var1 * fVar23 + fVar33 * fVar31;
                      if ((NAN(fVar21)) && (NAN(fVar26))) {
                        local_c8._4_4_ = uVar39;
                        local_c8._0_4_ = fVar22;
                        uStack_c0 = uVar40;
                        uStack_bc = uVar41;
                        local_88._4_4_ = uVar42;
                        local_88._0_4_ = fVar28;
                        local_88._8_4_ = uVar43;
                        local_88._12_4_ = uVar44;
                        local_98._4_4_ = fVar45;
                        local_98._0_4_ = fVar27;
                        fStack_90 = fVar34;
                        fStack_8c = fVar32;
                        local_a8 = fVar47;
                        fStack_a4 = fVar46;
                        fStack_a0 = fVar48;
                        fStack_9c = fVar49;
                        local_78 = fVar36;
                        fStack_74 = fVar30;
                        fStack_70 = fVar37;
                        fStack_6c = fVar38;
                        __mulsc3(_Var1,fVar33,uVar24,fVar23);
                        fVar22 = (float)local_c8._0_4_;
                        uVar39 = local_c8._4_4_;
                        fVar28 = (float)local_88._0_4_;
                        fVar27 = (float)local_98._0_4_;
                        fVar45 = (float)local_98._4_4_;
                        fVar47 = local_a8;
                        fVar46 = fStack_a4;
                        fVar36 = local_78;
                        fVar30 = fStack_74;
                        fVar21 = extraout_XMM0_Da_02;
                        fVar26 = extraout_XMM0_Db_02;
                      }
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar11]._M_value +
                                lVar13 + matrix->size_ * lVar18) =
                           CONCAT44(fVar30 + fVar26,fVar36 + fVar21);
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))->_M_value;
                      fVar34 = (float)(_Var1 >> 0x20);
                      fVar27 = fVar27 * (float)_Var1 - fVar46 * fVar34;
                      fVar45 = fVar45 * fVar34 + fVar47 * (float)_Var1;
                      if ((NAN(fVar27)) && (NAN(fVar45))) {
                        uVar25 = __mulsc3(_Var1,fVar34,CONCAT44(uVar39,fVar22),fVar28);
                        fVar27 = (float)uVar25;
                        fVar45 = (float)((ulong)uVar25 >> 0x20);
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_e0.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + (local_e0.size_ + 1) * 8))->_M_value;
                      fVar34 = (float)(_Var1 >> 0x20);
                      fVar22 = fVar31 * (float)_Var1 - fVar23 * fVar34;
                      fVar28 = (float)_Var1 * fVar23 + fVar34 * fVar31;
                      if ((NAN(fVar22)) && (NAN(fVar28))) {
                        __mulsc3(_Var1,fVar34,uVar24,fVar23);
                        fVar22 = extraout_XMM0_Da_03;
                        fVar28 = extraout_XMM0_Db_03;
                      }
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar17 + lVar11]._M_value +
                                lVar13 + matrix->size_ * lVar18) =
                           CONCAT44(fVar45 + fVar28,fVar27 + fVar22);
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar14 != lVar11);
                }
                lVar11 = local_b0 + 1;
                lVar13 = lVar13 + local_b8;
              } while (lVar11 != lVar19);
              lVar11 = matrix->size_;
            }
            lVar10 = lVar10 + 1;
            lVar18 = lVar18 + 8;
          } while (lVar10 < lVar11);
        }
      }
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_e0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_e0.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
      }
      if (local_60[0] != (int *)0x0) {
        operator_delete(local_60[0],local_50 - (long)local_60[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }